

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O0

void __thiscall
slang::ast::StructuredAssignmentPatternExpression::visitExprs<slang::ast::ExpressionVarVisitor&>
          (StructuredAssignmentPatternExpression *this,ExpressionVarVisitor *visitor)

{
  bool bVar1;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *in_RDI;
  IndexSetter *setter_2;
  iterator __end3_2;
  iterator __begin3_2;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *__range3_2;
  TypeSetter *setter_1;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *__range3_1;
  MemberSetter *setter;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  *__range3;
  Expression *in_stack_ffffffffffffff90;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *in_stack_ffffffffffffff98;
  __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
  local_60;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *local_58;
  reference local_50;
  TypeSetter *local_48;
  __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
  local_40;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *local_38;
  reference local_30;
  MemberSetter *local_28;
  __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
  local_20;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *local_18;
  
  local_18 = in_RDI + 4;
  local_20._M_current =
       (MemberSetter *)
       std::
       span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
       ::begin((span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                *)in_RDI);
  local_28 = (MemberSetter *)
             std::
             span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
             ::end((span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                    *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_30 = __gnu_cxx::
               __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
               ::operator*(&local_20);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x475dd2);
    Expression::visit<slang::ast::ExpressionVarVisitor&>
              (in_stack_ffffffffffffff90,(ExpressionVarVisitor *)in_RDI);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>_>
    ::operator++(&local_20);
  }
  local_38 = in_RDI + 5;
  local_40._M_current =
       (TypeSetter *)
       std::
       span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
       ::begin((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                *)in_RDI);
  local_48 = (TypeSetter *)
             std::
             span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
             ::end((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                    *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
               ::operator*(&local_40);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x475e4a);
    Expression::visit<slang::ast::ExpressionVarVisitor&>
              (in_stack_ffffffffffffff90,(ExpressionVarVisitor *)in_RDI);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
    ::operator++(&local_40);
  }
  local_58 = in_RDI + 6;
  local_60._M_current =
       (IndexSetter *)
       std::
       span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
       ::begin(in_RDI);
  std::
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffff90 =
         (Expression *)
         __gnu_cxx::
         __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
         ::operator*(&local_60);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x475ebe);
    Expression::visit<slang::ast::ExpressionVarVisitor&>
              (in_stack_ffffffffffffff90,(ExpressionVarVisitor *)in_RDI);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x475ed9);
    Expression::visit<slang::ast::ExpressionVarVisitor&>
              (in_stack_ffffffffffffff90,(ExpressionVarVisitor *)in_RDI);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>_>
    ::operator++(&local_60);
  }
  if (in_RDI[7]._M_ptr != (pointer)0x0) {
    Expression::visit<slang::ast::ExpressionVarVisitor&>
              (in_stack_ffffffffffffff90,(ExpressionVarVisitor *)in_RDI);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& setter : memberSetters)
            setter.expr->visit(visitor);
        for (auto& setter : typeSetters)
            setter.expr->visit(visitor);
        for (auto& setter : indexSetters) {
            setter.index->visit(visitor);
            setter.expr->visit(visitor);
        }
        if (defaultSetter)
            defaultSetter->visit(visitor);
    }